

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
TargetPropertyEntryFinder::operator()
          (TargetPropertyEntryFinder *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *entry)

{
  bool bVar1;
  size_type __n;
  cmMakefile *mf;
  string_view arg;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_b8;
  LocationMatcher local_b0;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_a8;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_a0;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_98;
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *local_90;
  CreateLocation local_88;
  back_insert_iterator<std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  undefined1 local_58 [8];
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> locations;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry_local;
  TargetPropertyEntryFinder *this_local;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = &entry->Value;
  arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)entry);
  locations.super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg._M_len;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30,arg,false);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::vector
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::reserve
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58,__n);
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  local_80 = std::
             back_inserter<std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>
                       ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)
                        local_58);
  mf = cmSourceFileLocation::GetMakefile(this->Needle);
  CreateLocation::CreateLocation(&local_88,mf);
  local_90 = (vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)
             std::
             transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,CreateLocation>
                       (local_70,local_78,local_80,local_88);
  local_a0._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::begin
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  local_a8._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::end
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  LocationMatcher::LocationMatcher(&local_b0,this->Needle);
  local_98 = std::
             find_if<__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,LocationMatcher>
                       (local_a0,local_a8,local_b0);
  local_b8._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::end
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  bVar1 = __gnu_cxx::operator!=(&local_98,&local_b8);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::~vector
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return bVar1;
}

Assistant:

bool operator()(BT<std::string> const& entry)
  {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    std::vector<cmSourceFileLocation> locations;
    locations.reserve(files.size());
    std::transform(files.begin(), files.end(), std::back_inserter(locations),
                   CreateLocation(this->Needle.GetMakefile()));

    return std::find_if(locations.begin(), locations.end(),
                        LocationMatcher(this->Needle)) != locations.end();
  }